

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O2

void __thiscall
HBT_correlation::combine_and_bin_particle_pairs
          (HBT_correlation *this,vector<int,_std::allocator<int>_> *event_list)

{
  pretty_ostream *this_00;
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar12;
  pointer puVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  unsigned_long_long *puVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  ulong unaff_RBP;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double __y;
  double dVar48;
  ulong local_240;
  vector<particle_info,_std::allocator<particle_info>_> temp_particle_list;
  string local_e8;
  value_type local_c8;
  string local_50;
  
  temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar14 = tanh(this->Krap_max_);
  dVar15 = tanh(this->Krap_min_);
  local_240 = unaff_RBP;
  for (lVar20 = 0; lVar20 < this->number_of_oversample_events_; lVar20 = lVar20 + 1) {
    local_240 = (ulong)(event_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar20];
    pvVar12 = (((this->particle_list).
                super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               particle_list->
              super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
              )._M_impl.super__Vector_impl_data._M_start[local_240];
    uVar18 = ((long)*(pointer *)
                     ((long)&pvVar12->
                             super__Vector_base<particle_info,_std::allocator<particle_info>_> + 8)
             - *(long *)&pvVar12->super__Vector_base<particle_info,_std::allocator<particle_info>_>)
             / 0x78;
    uVar19 = uVar18 & 0xffffffff;
    if ((int)uVar18 < 1) {
      uVar19 = 0;
    }
    for (lVar30 = 0; uVar19 * 0x78 - lVar30 != 0; lVar30 = lVar30 + 0x78) {
      lVar24 = *(long *)&(((this->particle_list).
                           super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          particle_list->
                         super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[local_240]->
                         super__Vector_base<particle_info,_std::allocator<particle_info>_>;
      pdVar1 = (double *)(lVar24 + 0x28 + lVar30);
      dVar2 = *pdVar1;
      dVar3 = pdVar1[1];
      dVar33 = dVar2 / dVar3;
      if ((dVar15 < dVar33) && (dVar33 < dVar14)) {
        local_c8.px = *(double *)(lVar24 + 0x18 + lVar30);
        local_c8.py = *(double *)(lVar24 + 0x20 + lVar30);
        local_c8.mass = *(double *)(lVar24 + 8 + lVar30);
        local_c8.x = *(double *)(lVar24 + 0x38 + lVar30);
        local_c8.y = *(double *)(lVar24 + 0x40 + lVar30);
        local_c8.z = *(double *)(lVar24 + 0x48 + lVar30);
        local_c8.t = *(double *)(lVar24 + 0x50 + lVar30);
        local_c8.pz = dVar2;
        local_c8.E = dVar3;
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  (&temp_particle_list,&local_c8);
      }
    }
  }
  lVar30 = ((long)temp_particle_list.
                  super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)temp_particle_list.
                 super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x78;
  this_00 = &this->messager;
  std::operator<<((ostream *)this_00,"number of pairs: ");
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)this_00);
  std::__cxx11::string::string((string *)&local_e8,"info",(allocator *)&local_c8);
  pretty_ostream::flush(this_00,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  dVar14 = this->KT_min;
  dVar15 = this->KT_max;
  lVar24 = 0;
  lVar20 = 0;
  if (0 < lVar30) {
    lVar20 = lVar30;
  }
  lVar29 = 1;
  do {
    if (lVar24 == lVar20) {
      if (temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl
        .super__Vector_impl_data._M_finish =
             temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      std::_Vector_base<particle_info,_std::allocator<particle_info>_>::~_Vector_base
                (&temp_particle_list.
                  super__Vector_base<particle_info,_std::allocator<particle_info>_>);
      return;
    }
    dVar2 = temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar24].px;
    dVar3 = temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar24].py;
    dVar33 = temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar24].pz;
    dVar4 = temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar24].E;
    dVar5 = temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar24].x;
    dVar6 = temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar24].y;
    dVar7 = temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar24].z;
    dVar8 = temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar24].t;
    lVar24 = lVar24 + 1;
    for (lVar28 = lVar29; lVar28 < lVar30; lVar28 = lVar28 + 1) {
      dVar47 = (dVar2 + temp_particle_list.
                        super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar28].px) * 0.5;
      __y = (dVar3 + temp_particle_list.
                     super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar28].py) * 0.5;
      dVar35 = dVar47 * dVar47 + __y * __y;
      if ((dVar14 * dVar14 <= dVar35) && (dVar35 <= dVar15 * dVar15)) {
        dVar9 = temp_particle_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar28].pz;
        dVar37 = temp_particle_list.
                 super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar28].E;
        dVar39 = temp_particle_list.
                 super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar28].t;
        dVar41 = temp_particle_list.
                 super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar28].z;
        dVar35 = SQRT(dVar35);
        dVar46 = this->KT_min;
        dVar48 = this->dKT;
        dVar10 = temp_particle_list.
                 super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar28].x;
        dVar44 = dVar2 - temp_particle_list.
                         super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar28].px;
        dVar42 = dVar3 - temp_particle_list.
                         super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar28].py;
        dVar43 = dVar33 - dVar9;
        dVar16 = dVar4 - dVar37;
        dVar34 = ((dVar16 * dVar16 - dVar44 * dVar44) - dVar42 * dVar42) - dVar43 * dVar43;
        dVar11 = temp_particle_list.
                 super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar28].y;
        dVar38 = -dVar34;
        if (-0.0 < dVar34) {
          dVar38 = sqrt(dVar38);
        }
        else {
          dVar38 = SQRT(dVar38);
        }
        iVar17 = (int)((dVar35 - dVar46) / dVar48);
        dVar48 = -dVar44;
        dVar46 = -dVar43;
        dVar39 = dVar8 - dVar39;
        dVar10 = dVar5 - dVar10;
        dVar11 = dVar6 - dVar11;
        dVar41 = dVar7 - dVar41;
        if (this->invariant_radius_flag_ == 1) {
          puVar13 = (this->number_of_pairs_numerator_KTdiff_qinv_).
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar18 = puVar13[iVar17];
          if (uVar18 < this->needed_number_of_pairs * 0x32) {
            dVar36 = this->delta_q * 0.5;
            dVar34 = this->q_min - dVar36;
            if ((dVar34 + 1e-08 < dVar38) && (dVar38 < dVar36 + this->q_max + -1e-08)) {
              local_240 = local_240 & 0xffffffff;
              iVar25 = (int)((dVar38 - dVar34) / this->delta_q);
              puVar13[iVar17] = uVar18 + 1;
              dVar34 = cos((dVar46 * dVar41 + -dVar42 * dVar11 + dVar16 * dVar39 + dVar10 * dVar48)
                           * 5.067728853174532);
              this->correl_1d_inv_num_count[iVar17][iVar25] =
                   this->correl_1d_inv_num_count[iVar17][iVar25] + 1.0;
              this->q_inv_mean[iVar17][iVar25] = dVar38 + this->q_inv_mean[iVar17][iVar25];
              this->correl_1d_inv_num[iVar17][iVar25] =
                   dVar34 + this->correl_1d_inv_num[iVar17][iVar25];
            }
          }
        }
        dVar45 = dVar44 * (dVar47 / dVar35) + dVar42 * (__y / dVar35);
        dVar34 = this->delta_q;
        uVar31 = SUB84(dVar34,0);
        uVar32 = (undefined4)((ulong)dVar34 >> 0x20);
        dVar38 = dVar34 * 0.5;
        dVar44 = this->q_min - dVar38;
        dVar36 = dVar44 + 1e-08;
        if ((dVar36 <= dVar45) && (dVar40 = this->q_max + dVar38 + -1e-08, dVar45 <= dVar40)) {
          iVar25 = (int)((dVar45 - dVar44) / dVar34);
          if ((iVar25 < this->qnpts) &&
             ((dVar35 = dVar42 * (dVar47 / dVar35) + (__y / dVar35) * dVar48, dVar36 <= dVar35 &&
              (dVar35 <= dVar40)))) {
            local_240 = local_240 & 0xffffffff;
            iVar26 = (int)((dVar35 - dVar44) / dVar34);
            if (iVar26 < this->qnpts) {
              if (this->long_comoving_boost == true) {
                dVar34 = (dVar9 + dVar33) * 0.5;
                dVar37 = (dVar37 + dVar4) * 0.5;
                dVar9 = dVar37 * dVar37 - dVar34 * dVar34;
                if (dVar9 < 0.0) {
                  dVar9 = sqrt(dVar9);
                }
                else {
                  dVar9 = SQRT(dVar9);
                }
                dVar43 = ((-dVar34 / dVar37) * dVar16 + dVar43) * (dVar37 / dVar9);
                dVar38 = this->delta_q;
                uVar31 = SUB84(dVar38,0);
                uVar32 = (undefined4)((ulong)dVar38 >> 0x20);
                dVar38 = dVar38 * 0.5;
                dVar44 = this->q_min - dVar38;
                dVar36 = dVar44 + 1e-08;
              }
              if (((dVar36 <= dVar43) && (dVar43 <= dVar38 + this->q_max + -1e-08)) &&
                 (iVar22 = (int)((dVar43 - dVar44) / (double)CONCAT44(uVar32,uVar31)),
                 iVar22 < this->qnpts)) {
                if (this->azimuthal_flag_ == 0) {
                  puVar13 = (this->number_of_pairs_numerator_KTdiff).
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar18 = puVar13[iVar17];
                  if (uVar18 <= this->needed_number_of_pairs) {
                    puVar21 = puVar13 + iVar17;
LAB_0011fe06:
                    *puVar21 = uVar18 + 1;
                    dVar47 = cos((dVar46 * dVar41 +
                                 -dVar42 * dVar11 + dVar16 * dVar39 + dVar10 * dVar48) *
                                 5.067728853174532);
                    if (this->azimuthal_flag_ == 0) {
                      this->correl_3d_num_count[iVar17][iVar25][iVar26][iVar22] =
                           this->correl_3d_num_count[iVar17][iVar25][iVar26][iVar22] + 1.0;
                      this->q_out_mean[iVar17][iVar25][iVar26][iVar22] =
                           dVar45 + this->q_out_mean[iVar17][iVar25][iVar26][iVar22];
                      this->q_side_mean[iVar17][iVar25][iVar26][iVar22] =
                           dVar35 + this->q_side_mean[iVar17][iVar25][iVar26][iVar22];
                      this->q_long_mean[iVar17][iVar25][iVar26][iVar22] =
                           dVar43 + this->q_long_mean[iVar17][iVar25][iVar26][iVar22];
                      this->correl_3d_num[iVar17][iVar25][iVar26][iVar22] =
                           dVar47 + this->correl_3d_num[iVar17][iVar25][iVar26][iVar22];
                    }
                    else {
                      lVar27 = (long)(int)local_240;
                      this->correl_3d_Kphi_diff_num_count[iVar17][lVar27][iVar25][iVar26][iVar22] =
                           this->correl_3d_Kphi_diff_num_count[iVar17][lVar27][iVar25][iVar26]
                           [iVar22] + 1.0;
                      this->q_out_diff_mean[iVar17][lVar27][iVar25][iVar26][iVar22] =
                           dVar45 + this->q_out_diff_mean[iVar17][lVar27][iVar25][iVar26][iVar22];
                      this->q_side_diff_mean[iVar17][lVar27][iVar25][iVar26][iVar22] =
                           dVar35 + this->q_side_diff_mean[iVar17][lVar27][iVar25][iVar26][iVar22];
                      this->q_long_diff_mean[iVar17][lVar27][iVar25][iVar26][iVar22] =
                           dVar43 + this->q_long_diff_mean[iVar17][lVar27][iVar25][iVar26][iVar22];
                      this->correl_3d_Kphi_diff_num[iVar17][lVar27][iVar25][iVar26][iVar22] =
                           dVar47 + this->correl_3d_Kphi_diff_num[iVar17][lVar27][iVar25][iVar26]
                                    [iVar22];
                    }
                  }
                }
                else {
                  dVar47 = atan2(__y,dVar47);
                  for (dVar47 = dVar47 - this->psi_ref; dVar47 < 0.0;
                      dVar47 = dVar47 + 6.283185307179586) {
                  }
                  for (; 6.283185307179586 < dVar47; dVar47 = dVar47 + -6.283185307179586) {
                  }
                  uVar23 = (uint)(dVar47 / this->dKphi);
                  if (((int)uVar23 < 0) || (this->n_Kphi <= (int)uVar23)) {
                    local_240 = (ulong)uVar23;
                    std::operator<<((ostream *)this_00,"delta_phi = ");
                    std::ostream::_M_insert<double>(dVar47);
                    std::operator<<((ostream *)this_00," is out of bound of [0, 2pi]! ");
                    std::operator<<((ostream *)this_00,"Kphi_idx = ");
                    std::ostream::operator<<(this_00,uVar23);
                    std::__cxx11::string::string
                              ((string *)&local_50,"warning",(allocator *)&local_c8);
                    pretty_ostream::flush(this_00,&local_50);
                    std::__cxx11::string::~string((string *)&local_50);
                  }
                  else {
                    local_240 = (ulong)uVar23;
                    uVar18 = this->number_of_pairs_numerator_KTKphidiff[iVar17][uVar23];
                    if (uVar18 <= this->needed_number_of_pairs) {
                      puVar21 = this->number_of_pairs_numerator_KTKphidiff[iVar17] + uVar23;
                      goto LAB_0011fe06;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    lVar29 = lVar29 + 1;
  } while( true );
}

Assistant:

void HBT_correlation::combine_and_bin_particle_pairs(
    std::vector<int> event_list) {
    double hbarC_inv = 1. / hbarC;
    std::vector<particle_info> temp_particle_list;
    double particle_list_rapidity_cut_max = tanh(Krap_max_);
    double particle_list_rapidity_cut_min = tanh(Krap_min_);
    for (int j = 0; j < number_of_oversample_events_; j++) {
        int event_id = event_list[j];
        int event_number_particle =
            (particle_list->get_number_of_particles(event_list[j]));
        for (int i = 0; i < event_number_particle; i++) {
            double temp_E = particle_list->get_particle(event_id, i).E;
            double temp_pz = particle_list->get_particle(event_id, i).pz;
            double temp_ratio = temp_pz / temp_E;
            if (temp_ratio > particle_list_rapidity_cut_min
                && temp_ratio < particle_list_rapidity_cut_max) {
                particle_info temp_particle;
                temp_particle.E = temp_E;
                temp_particle.pz = temp_pz;
                temp_particle.px = particle_list->get_particle(event_id, i).px;
                temp_particle.py = particle_list->get_particle(event_id, i).py;
                temp_particle.mass =
                    (particle_list->get_particle(event_id, i).mass);
                temp_particle.x = particle_list->get_particle(event_id, i).x;
                temp_particle.y = particle_list->get_particle(event_id, i).y;
                temp_particle.z = particle_list->get_particle(event_id, i).z;
                temp_particle.t = particle_list->get_particle(event_id, i).t;
                temp_particle_list.push_back(temp_particle);
            }
        }
    }
    long long int number_of_particles = temp_particle_list.size();
    unsigned long long int number_of_pairs =
        (number_of_particles * (number_of_particles - 1) / 2);

    // nested pair loop
    messager << "number of pairs: " << number_of_pairs;
    messager.flush("info");
    double KT_min_sq = KT_min * KT_min;
    double KT_max_sq = KT_max * KT_max;
    for (int i = 0; i < number_of_particles; i++) {
        double particle_1_px = temp_particle_list[i].px;
        double particle_1_py = temp_particle_list[i].py;
        double particle_1_pz = temp_particle_list[i].pz;
        double particle_1_E = temp_particle_list[i].E;
        double particle_1_x = temp_particle_list[i].x;
        double particle_1_y = temp_particle_list[i].y;
        double particle_1_z = temp_particle_list[i].z;
        double particle_1_t = temp_particle_list[i].t;

        for (int j = i + 1; j < number_of_particles; j++) {
            double particle_2_px = temp_particle_list[j].px;
            double particle_2_py = temp_particle_list[j].py;
            double particle_2_pz = temp_particle_list[j].pz;
            double particle_2_E = temp_particle_list[j].E;
            double particle_2_x = temp_particle_list[j].x;
            double particle_2_y = temp_particle_list[j].y;
            double particle_2_z = temp_particle_list[j].z;
            double particle_2_t = temp_particle_list[j].t;

            double K_z = 0.5 * (particle_1_pz + particle_2_pz);
            double K_E = 0.5 * (particle_1_E + particle_2_E);
            double K_z_over_K_E = K_z / K_E;

            // K_T cut
            double K_x = 0.5 * (particle_1_px + particle_2_px);
            double K_y = 0.5 * (particle_1_py + particle_2_py);
            double K_perp_sq = K_x * K_x + K_y * K_y;
            if (K_perp_sq < KT_min_sq || K_perp_sq > KT_max_sq) {
                continue;
            }

            double K_perp = sqrt(K_perp_sq);
            int Kperp_idx = static_cast<int>((K_perp - KT_min) / dKT);

            // calculate q_inv
            double q_x = particle_1_px - particle_2_px;
            double q_y = particle_1_py - particle_2_py;
            double q_z = particle_1_pz - particle_2_pz;
            double q_E = particle_1_E - particle_2_E;
            double local_q_inv =
                sqrt(-(q_E * q_E - q_x * q_x - q_y * q_y - q_z * q_z));

            double t_diff = particle_1_t - particle_2_t;
            double x_diff = particle_1_x - particle_2_x;
            double y_diff = particle_1_y - particle_2_y;
            double z_diff = particle_1_z - particle_2_z;

            if (invariant_radius_flag_ == 1) {
                if (number_of_pairs_numerator_KTdiff_qinv_[Kperp_idx]
                    < 50 * needed_number_of_pairs) {
                    if (local_q_inv > (q_min - delta_q / 2. + 1e-8)
                        && local_q_inv < (q_max + delta_q / 2. - 1e-8)) {
                        int qinv_idx = static_cast<int>(
                            (local_q_inv - (q_min - delta_q / 2.)) / delta_q);
                        number_of_pairs_numerator_KTdiff_qinv_[Kperp_idx]++;
                        double cos_qx =
                            cos(hbarC_inv
                                * (q_E * t_diff - q_x * x_diff - q_y * y_diff
                                   - q_z * z_diff));
                        correl_1d_inv_num_count[Kperp_idx][qinv_idx]++;
                        q_inv_mean[Kperp_idx][qinv_idx] += local_q_inv;
                        correl_1d_inv_num[Kperp_idx][qinv_idx] += cos_qx;
                    }
                }
            }

            // calculate qout and qside in lcms
            double cos_K_phi = K_x / K_perp;
            double sin_K_phi = K_y / K_perp;

            double local_q_out = q_x * cos_K_phi + q_y * sin_K_phi;
            if (local_q_out < (q_min - delta_q / 2. + 1e-8)
                || local_q_out > (q_max + delta_q / 2. - 1e-8)) {
                continue;
            }

            int qout_idx = static_cast<int>(
                (local_q_out - (q_min - delta_q / 2.)) / delta_q);
            if (qout_idx >= qnpts) continue;

            double local_q_side = q_y * cos_K_phi - q_x * sin_K_phi;
            if (local_q_side < (q_min - delta_q / 2. + 1e-8)
                || local_q_side > (q_max + delta_q / 2. - 1e-8)) {
                continue;
            }

            int qside_idx = static_cast<int>(
                (local_q_side - (q_min - delta_q / 2.)) / delta_q);
            if (qside_idx >= qnpts) continue;

            double local_q_long = q_z;
            if (long_comoving_boost) {
                // calcualte qlong in the lcms
                double Mt = sqrt(K_E * K_E - K_z * K_z);
                double boost_gamma = K_E / Mt;
                double boost_beta = K_z_over_K_E;
                // boost qz to lcms
                local_q_long = boost_gamma * (q_z - boost_beta * q_E);
            }

            if (local_q_long < (q_min - delta_q / 2. + 1e-8)
                || local_q_long > (q_max + delta_q / 2. - 1e-8)) {
                continue;
            }
            int qlong_idx = static_cast<int>(
                (local_q_long - (q_min - delta_q / 2.)) / delta_q);
            if (qlong_idx >= qnpts) continue;

            int Kphi_idx;
            if (azimuthal_flag_ == 0) {
                if (number_of_pairs_numerator_KTdiff[Kperp_idx]
                    > needed_number_of_pairs) {
                    continue;
                }
                number_of_pairs_numerator_KTdiff[Kperp_idx]++;
            } else {
                double local_K_phi = atan2(K_y, K_x);
                double delta_phi = local_K_phi - psi_ref;
                while (delta_phi < 0.) {
                    delta_phi += 2. * M_PI;
                }
                while (delta_phi > 2. * M_PI) {
                    delta_phi -= 2. * M_PI;
                }
                Kphi_idx = static_cast<int>(delta_phi / dKphi);
                if (Kphi_idx < 0 || Kphi_idx >= n_Kphi) {
                    messager << "delta_phi = " << delta_phi
                             << " is out of bound of [0, 2pi]! "
                             << "Kphi_idx = " << Kphi_idx;
                    messager.flush("warning");
                    continue;
                }
                if (number_of_pairs_numerator_KTKphidiff[Kperp_idx][Kphi_idx]
                    > needed_number_of_pairs) {
                    continue;
                }
                number_of_pairs_numerator_KTKphidiff[Kperp_idx][Kphi_idx]++;
            }

            double cos_qx = cos(
                hbarC_inv
                * (q_E * t_diff - q_x * x_diff - q_y * y_diff - q_z * z_diff));

            // bin results
            if (azimuthal_flag_ == 0) {
                correl_3d_num_count[Kperp_idx][qout_idx][qside_idx]
                                   [qlong_idx]++;
                q_out_mean[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    local_q_out;
                q_side_mean[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    local_q_side;
                q_long_mean[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    local_q_long;
                correl_3d_num[Kperp_idx][qout_idx][qside_idx][qlong_idx] +=
                    cos_qx;
            } else {
                correl_3d_Kphi_diff_num_count[Kperp_idx][Kphi_idx][qout_idx]
                                             [qside_idx][qlong_idx]++;
                q_out_diff_mean[Kperp_idx][Kphi_idx][qout_idx][qside_idx]
                               [qlong_idx] += local_q_out;
                q_side_diff_mean[Kperp_idx][Kphi_idx][qout_idx][qside_idx]
                                [qlong_idx] += local_q_side;
                q_long_diff_mean[Kperp_idx][Kphi_idx][qout_idx][qside_idx]
                                [qlong_idx] += local_q_long;
                correl_3d_Kphi_diff_num[Kperp_idx][Kphi_idx][qout_idx]
                                       [qside_idx][qlong_idx] += cos_qx;
            }
        }
    }
    temp_particle_list.clear();
}